

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O1

int amqp_messenger_start(AMQP_MESSENGER_HANDLE messenger_handle,SESSION_HANDLE session_handle)

{
  AMQP_MESSENGER_CONFIG *pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0 || session_handle == (SESSION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x4ae;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4ae;
    }
    pcVar5 = "Invalid argument (session_handle is NULL)";
    iVar3 = 0x4ad;
  }
  else {
    if (messenger_handle->state == AMQP_MESSENGER_STATE_STOPPED) {
      messenger_handle->session_handle = session_handle;
      messenger_handle->state = AMQP_MESSENGER_STATE_STARTING;
      pAVar1 = messenger_handle->config;
      if (pAVar1 == (AMQP_MESSENGER_CONFIG *)0x0) {
        return 0;
      }
      if (pAVar1->on_state_changed_callback == (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0) {
        return 0;
      }
      (*pAVar1->on_state_changed_callback)
                (pAVar1->on_state_changed_context,AMQP_MESSENGER_STATE_STOPPED,
                 AMQP_MESSENGER_STATE_STARTING);
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x4b6;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4b6;
    }
    pcVar5 = 
    "amqp_messenger_start failed (current state is %d; expected AMQP_MESSENGER_STATE_STOPPED)";
    iVar3 = 0x4b7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
            ,"amqp_messenger_start",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int amqp_messenger_start(AMQP_MESSENGER_HANDLE messenger_handle, SESSION_HANDLE session_handle)
{
    int result;

    if (messenger_handle == NULL || session_handle == NULL)
    {
        LogError("Invalid argument (session_handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != AMQP_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("amqp_messenger_start failed (current state is %d; expected AMQP_MESSENGER_STATE_STOPPED)", instance->state);
        }
        else
        {
            instance->session_handle = session_handle;

            update_messenger_state(instance, AMQP_MESSENGER_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}